

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::EvaluateExpression(FParser *this,svalue_t *result,int start,int stop)

{
  char *value;
  int stop_00;
  int start_00;
  ulong uVar1;
  int iVar2;
  FString *this_00;
  undefined8 extraout_RAX;
  ulong uVar3;
  long *plVar4;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar5;
  long lVar6;
  int stop_local;
  int start_local;
  FString tempstr;
  
  stop_local = stop;
  start_local = start;
  if ((this->TokenType[start] == operator_) && (this->TokenType[stop] == operator_)) {
    PointlessBrackets(this,&start_local,&stop_local);
  }
  start_00 = start_local;
  stop_00 = stop_local;
  if (start_local == stop_local) {
    SimpleEvaluate(this,result,stop_local);
    return;
  }
  uVar5 = (ulong)(uint)num_operators;
  if (num_operators < 1) {
    uVar5 = 0;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar5 * 0x20 + 0x20 == uVar3 + 0x20) {
      lVar6 = (long)start_00;
      if (this->TokenType[lVar6] == function) {
        EvaluateFunction(this,result,start_00,stop_00);
        return;
      }
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      tempstr.Chars = FString::NullString.Nothing;
      for (; lVar6 <= stop_00; lVar6 = lVar6 + 1) {
        this_00 = FString::operator+=(&tempstr,this->Tokens[lVar6]);
        FString::operator+=(this_00,' ');
      }
      script_error("couldnt evaluate expression: %s\n",tempstr.Chars);
      FString::~FString(&tempstr);
      _Unwind_Resume(extraout_RAX);
    }
    value = *(char **)((long)&operators[0].string + uVar3);
    if (*(int *)((long)&operators[0].direction + uVar3) == 0) {
      iVar2 = FindOperatorBackwards(this,start_00,stop_00,value);
    }
    else {
      iVar2 = FindOperator(this,start_00,stop_00,value);
    }
    uVar1 = uVar3 + 0x20;
  } while (iVar2 == -1);
  UNRECOVERED_JUMPTABLE = *(code **)((long)&operators[0].handler + uVar3);
  plVar4 = (long *)((long)this->Tokens + *(long *)(&operators[0].field_0x10 + uVar3) + -0x10);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar4 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar4,result,start_00,iVar2,stop_00,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void FParser::EvaluateExpression(svalue_t &result, int start, int stop)
{
	int i, n;
	
	// possible pointless brackets
	if(TokenType[start] == operator_ && TokenType[stop] == operator_)
		PointlessBrackets(&start, &stop);

	if(start == stop)       // only 1 thing to evaluate
    {
		SimpleEvaluate(result, start);
		return;
    }
	
	// go through each operator in order of precedence
	for(i=0; i<num_operators; i++)
    {
		// check backwards for the token. it has to be
		// done backwards for left-to-right reading: eg so
		// 5-3-2 is (5-3)-2 not 5-(3-2)
		
		if (operators[i].direction==forward)
		{
			n = FindOperatorBackwards(start, stop, operators[i].string);
		}
		else
		{
			n = FindOperator(start, stop, operators[i].string);
		}

		if( n != -1)
		{
			// call the operator function and evaluate this chunk of tokens
			(this->*operators[i].handler)(result, start, n, stop);
			return;
		}
    }
	
	if(TokenType[start] == function)
	{
		EvaluateFunction(result, start, stop);
		return;
	}
	
	// error ?
	{        
		FString tempstr;
		
		for(i=start; i<=stop; i++) tempstr << Tokens[i] << ' ';
		script_error("couldnt evaluate expression: %s\n",tempstr.GetChars());
	}
}